

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> * __thiscall
array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::operator=
          (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this,
          array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int new_len;
  CRule *pCVar3;
  CRule *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  
  new_len = other->num_elements;
  if (this->list_size < new_len) {
    alloc(this,new_len);
  }
  this->num_elements = new_len;
  if (0 < new_len) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      pCVar3 = other->list;
      pCVar4 = this->list;
      *(undefined8 *)((long)&pCVar4->m_HFlip + lVar8) =
           *(undefined8 *)((long)&pCVar3->m_HFlip + lVar8);
      puVar1 = (undefined8 *)((long)&(pCVar3->m_Rect).field_0 + lVar8);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_RelativePos).field_0 + lVar8);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pCVar4->m_RelativePos).field_0 + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)&(pCVar4->m_Rect).field_0 + lVar8);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x28;
    } while (lVar9 < this->num_elements);
  }
  return this;
}

Assistant:

array &operator = (const array &other)
	{
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
		return *this;
	}